

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

Int32 testing::internal::Int32FromEnvOrDie(char *var,Int32 default_val)

{
  bool bVar1;
  char *str;
  Message *src_text;
  char *local_30;
  char *var_local;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_20;
  Int32 result;
  
  local_30 = var;
  str = getenv(var);
  if (str != (char *)0x0) {
    Message::Message((Message *)&stack0xffffffffffffffe0);
    std::operator<<((ostream *)(sStack_20.ptr_ + 0x10),"The value of environment variable ");
    src_text = Message::operator<<((Message *)&stack0xffffffffffffffe0,&local_30);
    bVar1 = ParseInt32(src_text,str,(Int32 *)((long)&var_local + 4));
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&stack0xffffffffffffffe0);
    default_val = var_local._4_4_;
    if (!bVar1) {
      exit(1);
    }
  }
  return default_val;
}

Assistant:

Int32 Int32FromEnvOrDie(const char* var, Int32 default_val) {
  const char* str_val = posix::GetEnv(var);
  if (str_val == NULL) {
    return default_val;
  }

  Int32 result;
  if (!ParseInt32(Message() << "The value of environment variable " << var,
                  str_val, &result)) {
    exit(EXIT_FAILURE);
  }
  return result;
}